

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::alloc
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,int new_len)

{
  CSkin *pCVar1;
  undefined1 auVar2 [16];
  CSkin *pCVar3;
  ulong uVar4;
  long lVar5;
  
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(200),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(200),0);
  }
  pCVar3 = (CSkin *)operator_new__(uVar4);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar1 = this->list;
  if (new_len < 1) {
    if (pCVar1 == (CSkin *)0x0) goto LAB_0017bd12;
  }
  else {
    lVar5 = 0;
    do {
      memcpy(pCVar3->m_aName + lVar5 + -4,pCVar1->m_aName + lVar5 + -4,200);
      lVar5 = lVar5 + 200;
    } while ((ulong)(uint)new_len * 200 - lVar5 != 0);
  }
  operator_delete__(pCVar1);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_0017bd12:
  this->num_elements = new_len;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}